

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

FileError * CLI::FileError::Missing(string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_00000018;
  FileError *in_stack_00000020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  this = in_RDI;
  ::std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  FileError(in_stack_00000020,in_stack_00000018);
  ::std::__cxx11::string::~string(this);
  return (FileError *)in_RDI;
}

Assistant:

static FileError Missing(std::string name) { return FileError(name + " was not readable (missing?)"); }